

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O2

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_node **ppsVar1;
  ushort uVar2;
  ushort uVar3;
  stbrp_node *psVar4;
  stbrp_node *psVar5;
  stbrp_context *psVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  stbrp_node **ppsVar10;
  long lVar11;
  int *piVar12;
  stbrp_node *psVar13;
  int iVar14;
  uint uVar15;
  stbrp_node **ppsVar16;
  stbrp_context *psVar17;
  ulong uVar18;
  char *in_R8;
  int iVar19;
  stbrp_context *psVar20;
  stbrp_rect *psVar21;
  uint local_8c;
  uint local_88;
  int local_84;
  stbrp_node **local_80;
  int local_58;
  int waste;
  size_t local_50;
  ulong local_48;
  stbrp_rect *local_40;
  ulong local_38;
  
  uVar9 = 0;
  uVar18 = 0;
  if (0 < num_rects) {
    uVar18 = (ulong)(uint)num_rects;
  }
  piVar12 = &rects->was_packed;
  for (; uVar18 != uVar9; uVar9 = uVar9 + 1) {
    *piVar12 = (int)uVar9;
    piVar12 = piVar12 + 4;
  }
  local_50 = (size_t)num_rects;
  qsort(rects,local_50,0x10,rect_height_compare);
  ppsVar1 = &context->active_head;
  uVar9 = 0;
  local_48 = uVar18;
  local_40 = rects;
  do {
    if (uVar9 == uVar18) {
      qsort(rects,local_50,0x10,rect_original_order);
      for (lVar11 = 0; uVar18 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
        uVar15 = 1;
        if (*(short *)((long)&rects->x + lVar11) == -1) {
          uVar15 = (uint)(*(short *)((long)&rects->y + lVar11) != -1);
        }
        *(uint *)((long)&rects->was_packed + lVar11) = uVar15;
      }
      return (int)lVar11;
    }
    uVar2 = rects[uVar9].w;
    if ((uVar2 == 0) || (uVar3 = rects[uVar9].h, uVar3 == 0)) {
      rects[uVar9].x = 0;
      rects[uVar9].y = 0;
    }
    else {
      iVar14 = context->align;
      iVar19 = (uint)uVar2 + iVar14 + -1;
      iVar19 = iVar19 - iVar19 % iVar14;
      local_38 = (ulong)uVar2;
      if (iVar19 % iVar14 != 0) {
        in_R8 = "width % c->align == 0";
        LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                    ,0x168,"stbrp__skyline_find_best_pos","ImGui ASSERT FAILED: %s");
      }
      iVar14 = context->width;
      psVar21 = rects;
      if ((iVar19 <= iVar14) && ((int)(uint)uVar3 <= context->height)) {
        local_84 = 0x40000000;
        local_8c = 0x40000000;
        local_80 = (stbrp_node **)0x0;
        ppsVar16 = ppsVar1;
        psVar20 = (stbrp_context *)*ppsVar1;
        while( true ) {
          uVar2 = (ushort)psVar20->width;
          uVar15 = (uint)uVar3;
          if (iVar14 < (int)(iVar19 + (uint)uVar2)) break;
          uVar7 = stbrp__skyline_find_min_y
                            (psVar20,(stbrp_node *)(ulong)uVar2,iVar19,(int)&waste,(int *)in_R8);
          if (context->heuristic == 0) {
            if ((int)uVar7 < (int)local_8c) {
              local_8c = uVar7;
              local_80 = ppsVar16;
            }
          }
          else if (((int)(uVar15 + uVar7) <= context->height) &&
                  (((int)uVar7 < (int)local_8c || (waste < local_84 && uVar7 == local_8c)))) {
            local_84 = waste;
            local_8c = uVar7;
            local_80 = ppsVar16;
          }
          ppsVar16 = (stbrp_node **)&psVar20->align;
          iVar14 = context->width;
          psVar20 = *(stbrp_context **)&psVar20->align;
        }
        if (local_80 == (stbrp_node **)0x0) {
          local_88 = 0;
        }
        else {
          local_88 = (uint)(*local_80)->x;
        }
        if (context->heuristic == 1) {
          psVar20 = (stbrp_context *)*ppsVar1;
          psVar17 = psVar20;
          while (ppsVar16 = ppsVar1, (int)(uint)(ushort)psVar17->width < iVar19) {
            psVar17 = *(stbrp_context **)&psVar17->align;
          }
          for (; uVar18 = local_48, psVar21 = local_40, psVar17 != (stbrp_context *)0x0;
              psVar17 = *(stbrp_context **)&psVar17->align) {
            uVar7 = (uint)(ushort)psVar17->width - iVar19;
            psVar6 = psVar20;
            if ((int)uVar7 < 0) {
              in_R8 = "xpos >= 0";
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                          ,0x1a8,"stbrp__skyline_find_best_pos","ImGui ASSERT FAILED: %s");
            }
            do {
              psVar20 = psVar6;
              ppsVar10 = ppsVar16;
              ppsVar16 = (stbrp_node **)&psVar20->align;
              psVar6 = *(stbrp_context **)&psVar20->align;
            } while ((int)(uint)(ushort)(*(stbrp_context **)&psVar20->align)->width <= (int)uVar7);
            if ((int)uVar7 < (int)(uint)(ushort)psVar20->width) {
              in_R8 = "node->next->x > xpos && node->x <= xpos";
              LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imstb_rectpack.h"
                          ,0x1ae,"stbrp__skyline_find_best_pos","ImGui ASSERT FAILED: %s");
            }
            uVar8 = stbrp__skyline_find_min_y
                              (psVar20,(stbrp_node *)(ulong)uVar7,iVar19,(int)&local_58,(int *)in_R8
                              );
            if ((((int)(uVar15 + uVar8) <= context->height) && ((int)uVar8 <= (int)local_8c)) &&
               (((uVar8 < local_8c || (local_58 < local_84)) ||
                ((local_58 == local_84 && ((int)uVar7 < (int)local_88)))))) {
              local_84 = local_58;
              local_8c = uVar8;
              local_88 = uVar7;
              local_80 = ppsVar10;
            }
            ppsVar16 = ppsVar10;
          }
        }
        if (((local_80 != (stbrp_node **)0x0) && ((int)(uVar15 + local_8c) <= context->height)) &&
           (psVar4 = context->free_head, psVar4 != (stbrp_node *)0x0)) {
          psVar4->x = (stbrp_coord)local_88;
          psVar4->y = (stbrp_coord)(uVar15 + local_8c);
          context->free_head = psVar4->next;
          psVar5 = *local_80;
          psVar13 = psVar5;
          if ((int)(uint)psVar5->x < (int)local_88) {
            psVar13 = psVar5->next;
            local_80 = &psVar5->next;
          }
          *local_80 = psVar4;
          iVar14 = local_88 + (int)local_38;
          while ((psVar5 = psVar13->next, psVar5 != (stbrp_node *)0x0 &&
                 ((int)(uint)psVar5->x <= iVar14))) {
            psVar13->next = context->free_head;
            context->free_head = psVar13;
            psVar13 = psVar5;
          }
          psVar4->next = psVar13;
          if ((int)(uint)psVar13->x < iVar14) {
            psVar13->x = (stbrp_coord)iVar14;
          }
          rects[uVar9].x = (stbrp_coord)local_88;
          rects[uVar9].y = (stbrp_coord)local_8c;
          rects = psVar21;
          goto LAB_001a9b67;
        }
      }
      rects[uVar9].x = 0xffff;
      rects[uVar9].y = 0xffff;
      rects = psVar21;
    }
LAB_001a9b67:
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}